

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
::find_position<unsigned_long>
          (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
           *this,unsigned_long *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  uVar5 = 0xffffffffffffffff;
  uVar2 = *key;
  while( true ) {
    uVar2 = uVar2 & this->num_buckets - 1;
    uVar1 = this->table[uVar2].first;
    if ((this->key_info).empty_key == uVar1) break;
    if ((this->num_deleted == 0) || ((this->key_info).delkey != uVar1)) {
      if (*key == uVar1) goto LAB_0099e0ab;
    }
    else if (uVar5 == 0xffffffffffffffff) {
      uVar5 = uVar2;
    }
    uVar2 = uVar2 + lVar4 + 1;
    lVar4 = lVar4 + 1;
  }
  uVar3 = uVar2;
  if (uVar5 != 0xffffffffffffffff) {
    uVar3 = uVar5;
  }
  uVar2 = 0xffffffffffffffff;
LAB_0099e0ab:
  pVar6.second = uVar3;
  pVar6.first = uVar2;
  return pVar6;
}

Assistant:

size_type bucket_count() const { return num_buckets; }